

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::AddNotDefinedError(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation,std::basic_string_view<char,std::char_traits<char>>)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  undefined8 *puVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  char *local_30;
  undefined8 local_28;
  size_type local_20;
  undefined8 local_18;
  char *local_10;
  
  lVar1 = *(long *)this;
  local_60 = *(undefined8 *)(lVar1 + 0x130);
  local_68 = *(undefined8 *)(lVar1 + 0x138);
  puVar2 = *(undefined8 **)(*(long *)(lVar1 + 0x128) + 8);
  local_40 = *puVar2;
  local_48 = puVar2[1];
  local_78 = 1;
  local_70 = "\"";
  local_58 = 0x1a;
  local_50 = "\" seems to be defined in \"";
  local_38 = 0x1d;
  local_30 = "\", which is not imported by \"";
  local_20 = *(size_type *)(lVar1 + 0x98);
  local_28 = *(undefined8 *)(lVar1 + 0xa0);
  local_18 = 0x34;
  local_10 = "\".  To use it here, please add the necessary import.";
  pieces._M_len = local_20;
  pieces._M_array = (iterator)0x7;
  strings_internal::CatPieces_abi_cxx11_
            (__return_storage_ptr__,(strings_internal *)&local_78,pieces);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}